

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this,Imputer *from)

{
  ReplaceValueUnion RVar1;
  uint32_t uVar2;
  ulong uVar3;
  Int64Vector *this_00;
  DoubleVector *this_01;
  ImputedValueUnion IVar4;
  StringToDoubleMap *this_02;
  Int64ToDoubleMap *this_03;
  undefined8 *puVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  undefined8 *puVar8;
  ImputedValueUnion IVar9;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_004b14c0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  this->_oneof_case_[0] = 0;
  uVar2 = from->_oneof_case_[0];
  switch(uVar2) {
  case 1:
    IVar9 = from->ImputedValue_;
    clear_ImputedValue(this);
    if (uVar2 != 1) {
      IVar9.imputeddoublevalue_ = 0.0;
    }
    this->_oneof_case_[0] = 1;
    this->ImputedValue_ = IVar9;
    break;
  case 2:
    IVar9 = from->ImputedValue_;
    clear_ImputedValue(this);
    IVar4.imputeddoublevalue_ = 0.0;
    if (uVar2 == 2) {
      IVar4 = IVar9;
    }
    this->_oneof_case_[0] = 2;
    (this->ImputedValue_).imputeddoublevalue_ = (double)IVar4;
    break;
  case 3:
    if (uVar2 == 3) {
      puVar8 = (undefined8 *)((from->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    }
    else {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 3;
    (this->ImputedValue_).imputeddoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ImputedValue_,puVar8,puVar5);
    break;
  case 4:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 4;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::DoubleVector>
                        (pAVar7);
    (this->ImputedValue_).imputeddoublearray_ = this_01;
    if (from->_oneof_case_[0] == 4) {
      puVar6 = (undefined1 *)(from->ImputedValue_).imputeddoublearray_;
    }
    else {
      puVar6 = _DoubleVector_default_instance_;
    }
    DoubleVector::MergeFrom(this_01,(DoubleVector *)puVar6);
    break;
  case 5:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 5;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar7);
    (this->ImputedValue_).imputedint64array_ = this_00;
    if (from->_oneof_case_[0] == 5) {
      puVar6 = (undefined1 *)(from->ImputedValue_).imputedint64array_;
    }
    else {
      puVar6 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar6);
    break;
  case 6:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 6;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringToDoubleMap>
                        (pAVar7);
    (this->ImputedValue_).imputedstringdictionary_ = this_02;
    if (from->_oneof_case_[0] == 6) {
      puVar6 = (undefined1 *)(from->ImputedValue_).imputedstringdictionary_;
    }
    else {
      puVar6 = _StringToDoubleMap_default_instance_;
    }
    StringToDoubleMap::MergeFrom(this_02,(StringToDoubleMap *)puVar6);
    break;
  case 7:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 7;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_03 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap>
                        (pAVar7);
    (this->ImputedValue_).imputedint64dictionary_ = this_03;
    if (from->_oneof_case_[0] == 7) {
      puVar6 = (undefined1 *)(from->ImputedValue_).imputedint64dictionary_;
    }
    else {
      puVar6 = _Int64ToDoubleMap_default_instance_;
    }
    Int64ToDoubleMap::MergeFrom(this_03,(Int64ToDoubleMap *)puVar6);
  }
  this->_oneof_case_[1] = 0;
  uVar2 = from->_oneof_case_[1];
  if (uVar2 == 0xd) {
    if (uVar2 == 0xd) {
      puVar8 = (undefined8 *)((from->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    }
    else {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xd;
    (this->ReplaceValue_).replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ReplaceValue_,puVar8,puVar5);
  }
  else if (uVar2 == 0xc) {
    RVar1 = from->ReplaceValue_;
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xc;
    this->ReplaceValue_ = RVar1;
  }
  else if (uVar2 == 0xb) {
    RVar1 = from->ReplaceValue_;
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xb;
    this->ReplaceValue_ = RVar1;
  }
  return;
}

Assistant:

Imputer::Imputer(const Imputer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_ImputedValue();
  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      _internal_set_imputeddoublevalue(from._internal_imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      _internal_set_imputedint64value(from._internal_imputedint64value());
      break;
    }
    case kImputedStringValue: {
      _internal_set_imputedstringvalue(from._internal_imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      _internal_mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from._internal_imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      _internal_mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      _internal_mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from._internal_imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      _internal_mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from._internal_imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  clear_has_ReplaceValue();
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      _internal_set_replacedoublevalue(from._internal_replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      _internal_set_replaceint64value(from._internal_replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      _internal_set_replacestringvalue(from._internal_replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Imputer)
}